

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryReader::readStrings(WasmBinaryReader *this)

{
  bool bVar1;
  uint32_t uVar2;
  char *in_RCX;
  string_view str;
  string local_260;
  Name local_240;
  allocator<char> local_229;
  string local_228;
  ostream *local_208;
  size_t sStack_200;
  stringstream local_1f8 [8];
  stringstream wtf16;
  String local_1e8 [376];
  undefined1 auStack_70 [8];
  Name string;
  size_t i;
  size_t num;
  allocator<char> local_39;
  string local_38;
  uint32_t local_14;
  WasmBinaryReader *pWStack_10;
  uint32_t reserved;
  WasmBinaryReader *this_local;
  
  pWStack_10 = this;
  local_14 = getU32LEB(this);
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"unexpected reserved value in strings",&local_39);
    throwError(this,&local_38);
  }
  uVar2 = getU32LEB(this);
  string.super_IString.str._M_str = (char *)0x0;
  while( true ) {
    if ((char *)(ulong)uVar2 <= string.super_IString.str._M_str) {
      return;
    }
    _auStack_70 = (string_view)getInlineString(this,false);
    std::__cxx11::stringstream::stringstream(local_1f8);
    local_208 = (ostream *)auStack_70;
    sStack_200 = string.super_IString.str._M_len;
    str._M_str = in_RCX;
    str._M_len = string.super_IString.str._M_len;
    bVar1 = String::convertWTF8ToWTF16(local_1e8,(ostream *)auStack_70,str);
    if (!bVar1) break;
    std::__cxx11::stringstream::str();
    wasm::Name::Name(&local_240,&local_260);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back(&this->strings,&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::stringstream::~stringstream(local_1f8);
    string.super_IString.str._M_str = string.super_IString.str._M_str + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"invalid string constant",&local_229);
  throwError(this,&local_228);
}

Assistant:

void WasmBinaryReader::readStrings() {
  auto reserved = getU32LEB();
  if (reserved != 0) {
    throwError("unexpected reserved value in strings");
  }
  size_t num = getU32LEB();
  for (size_t i = 0; i < num; i++) {
    auto string = getInlineString(false);
    // Re-encode from WTF-8 to WTF-16.
    std::stringstream wtf16;
    if (!String::convertWTF8ToWTF16(wtf16, string.str)) {
      throwError("invalid string constant");
    }
    // TODO: Use wtf16.view() once we have C++20.
    strings.push_back(wtf16.str());
  }
}